

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O1

void __thiscall pmx::PmxMorph::Read(PmxMorph *this,istream *stream,PmxSetting *setting)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PmxMorphUVOffset *pPVar4;
  PmxMorphBoneOffset *pPVar5;
  PmxMorphGroupOffset *pPVar6;
  PmxMorphVertexOffset *pPVar7;
  PmxMorphMaterialOffset *pPVar8;
  uint8_t in_CL;
  long lVar9;
  PmxMorphUVOffset *pPVar10;
  PmxMorphBoneOffset *pPVar11;
  PmxMorphGroupOffset *pPVar12;
  PmxMorphVertexOffset *pPVar13;
  PmxMorphMaterialOffset *pPVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->morph_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)&this->category);
  std::istream::read((char *)stream,(long)&this->morph_type);
  piVar1 = &this->offset_count;
  std::istream::read((char *)stream,(long)piVar1);
  switch(this->morph_type) {
  case Group:
    lVar9 = (long)*piVar1;
    uVar15 = 0xffffffffffffffff;
    if (-1 < lVar9) {
      uVar15 = lVar9 * 0x10;
    }
    pPVar6 = (PmxMorphGroupOffset *)operator_new__(uVar15);
    if (lVar9 != 0) {
      pPVar12 = pPVar6;
      do {
        (pPVar12->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010acd0;
        pPVar12->morph_index = 0;
        pPVar12->morph_weight = 0.0;
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar6 + lVar9);
    }
    pPVar12 = (this->group_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
    (this->group_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl = pPVar6;
    if (pPVar12 != (PmxMorphGroupOffset *)0x0) {
      operator_delete__(pPVar12);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      lVar17 = 0;
      do {
        pPVar6 = (this->group_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)
                    ((long)&(pPVar6->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar9))
                  ((long)&(pPVar6->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar9,stream,setting
                  );
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar17 < this->offset_count);
    }
    break;
  case Vertex:
    uVar16 = (ulong)*piVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
      uVar15 = SUB168(auVar3 * ZEXT816(0x18),0);
    }
    pPVar7 = (PmxMorphVertexOffset *)operator_new__(uVar15);
    if (uVar16 != 0) {
      pPVar13 = pPVar7;
      do {
        (pPVar13->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac10;
        pPVar13->vertex_index = 0;
        pPVar13->position_offset[0] = 0.0;
        pPVar13->position_offset[1] = 0.0;
        pPVar13->position_offset[2] = 0.0;
        pPVar13 = pPVar13 + 1;
      } while (pPVar13 != pPVar7 + uVar16);
    }
    pPVar13 = (this->vertex_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
    (this->vertex_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl = pPVar7;
    if (pPVar13 != (PmxMorphVertexOffset *)0x0) {
      operator_delete__(pPVar13);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      lVar17 = 0;
      do {
        pPVar7 = (this->vertex_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar7->position_offset + lVar9 + -0xc))
                  ((long)pPVar7->position_offset + lVar9 + -0xc,stream,setting);
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 0x18;
      } while (lVar17 < this->offset_count);
    }
    break;
  case Bone:
    uVar16 = (ulong)*piVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar16;
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
      uVar15 = SUB168(auVar2 * ZEXT816(0x28),0);
    }
    pPVar5 = (PmxMorphBoneOffset *)operator_new__(uVar15);
    if (uVar16 != 0) {
      pPVar11 = pPVar5;
      do {
        (pPVar11->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac70;
        pPVar11->bone_index = 0;
        pPVar11->translation[0] = 0.0;
        pPVar11->translation[1] = 0.0;
        pPVar11->translation[2] = 0.0;
        pPVar11->rotation[0] = 0.0;
        pPVar11->rotation[1] = 0.0;
        pPVar11->rotation[2] = 0.0;
        pPVar11->rotation[3] = 0.0;
        pPVar11 = pPVar11 + 1;
      } while (pPVar11 != pPVar5 + uVar16);
    }
    pPVar11 = (this->bone_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
    (this->bone_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>.
    _M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl = pPVar5;
    if (pPVar11 != (PmxMorphBoneOffset *)0x0) {
      operator_delete__(pPVar11);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      lVar17 = 0;
      do {
        pPVar5 = (this->bone_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar5->translation + lVar9 + -0xc))
                  ((long)pPVar5->translation + lVar9 + -0xc,stream,setting);
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 0x28;
      } while (lVar17 < this->offset_count);
    }
    break;
  case UV:
  case AdditionalUV1:
  case AdditionalUV2:
  case AdditionalUV3:
  case AdditionalUV4:
    lVar9 = (long)*piVar1;
    uVar15 = 0xffffffffffffffff;
    if (-1 < lVar9) {
      uVar15 = lVar9 * 0x20;
    }
    pPVar4 = (PmxMorphUVOffset *)operator_new__(uVar15);
    if (lVar9 != 0) {
      pPVar10 = pPVar4;
      do {
        (pPVar10->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac40;
        pPVar10->vertex_index = 0;
        pPVar10->uv_offset[0] = 0.0;
        pPVar10->uv_offset[1] = 0.0;
        pPVar10->uv_offset[2] = 0.0;
        pPVar10->uv_offset[3] = 0.0;
        pPVar10 = pPVar10 + 1;
      } while (pPVar10 != pPVar4 + lVar9);
    }
    pPVar10 = (this->uv_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
    (this->uv_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>._M_t
    .super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>.
    super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl = pPVar4;
    if (pPVar10 != (PmxMorphUVOffset *)0x0) {
      operator_delete__(pPVar10);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      lVar17 = 0;
      do {
        pPVar4 = (this->uv_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar4->uv_offset + lVar9 + -0xc))
                  ((long)pPVar4->uv_offset + lVar9 + -0xc,stream,setting);
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 0x20;
      } while (lVar17 < this->offset_count);
    }
    break;
  case Matrial:
    lVar9 = (long)*piVar1;
    uVar15 = 0xffffffffffffffff;
    if (-1 < lVar9) {
      uVar15 = lVar9 * 0x80;
    }
    pPVar8 = (PmxMorphMaterialOffset *)operator_new__(uVar15);
    if (lVar9 != 0) {
      pPVar14 = pPVar8;
      do {
        (pPVar14->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010aca0;
        pPVar14->diffuse[0] = 0.0;
        pPVar14->diffuse[1] = 0.0;
        pPVar14->diffuse[2] = 0.0;
        pPVar14->diffuse[3] = 0.0;
        pPVar14->specular[0] = 0.0;
        pPVar14->specular[1] = 0.0;
        *(undefined8 *)(pPVar14->specular + 2) = 0;
        pPVar14->ambient[0] = 0.0;
        pPVar14->ambient[1] = 0.0;
        *(undefined8 *)(pPVar14->ambient + 2) = 0;
        pPVar14->edge_color[1] = 0.0;
        pPVar14->edge_color[2] = 0.0;
        *(undefined8 *)(pPVar14->edge_color + 3) = 0;
        pPVar14->texture_argb[0] = 0.0;
        pPVar14->texture_argb[1] = 0.0;
        pPVar14->texture_argb[2] = 0.0;
        pPVar14->texture_argb[3] = 0.0;
        pPVar14->sphere_texture_argb[0] = 0.0;
        pPVar14->sphere_texture_argb[1] = 0.0;
        pPVar14->sphere_texture_argb[2] = 0.0;
        pPVar14->sphere_texture_argb[3] = 0.0;
        pPVar14->toon_texture_argb[0] = 0.0;
        pPVar14->toon_texture_argb[1] = 0.0;
        pPVar14->toon_texture_argb[2] = 0.0;
        pPVar14->toon_texture_argb[3] = 0.0;
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != pPVar8 + lVar9);
    }
    pPVar14 = (this->material_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
    (this->material_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl = pPVar8;
    if (pPVar14 != (PmxMorphMaterialOffset *)0x0) {
      operator_delete__(pPVar14);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      lVar17 = 0;
      do {
        pPVar8 = (this->material_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar8->diffuse + lVar9 + -0x10))
                  ((long)pPVar8->diffuse + lVar9 + -0x10,stream,setting);
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 0x80;
      } while (lVar17 < this->offset_count);
    }
    break;
  default:
    __cxa_rethrow();
  }
  return;
}

Assistant:

void PmxMorph::Read(std::istream *stream, PmxSetting *setting)
	{
		this->morph_name = ReadString(stream, setting->encoding);
		this->morph_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &category, sizeof(MorphCategory));
		stream->read((char*) &morph_type, sizeof(MorphType));
		stream->read((char*) &this->offset_count, sizeof(int));
		switch (this->morph_type)
		{
		case MorphType::Group:
			group_offsets = std::make_unique<PmxMorphGroupOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				group_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Vertex:
			vertex_offsets = std::make_unique<PmxMorphVertexOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				vertex_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Bone:
			bone_offsets = std::make_unique<PmxMorphBoneOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				bone_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Matrial:
			material_offsets = std::make_unique<PmxMorphMaterialOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				material_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::UV:
		case MorphType::AdditionalUV1:
		case MorphType::AdditionalUV2:
		case MorphType::AdditionalUV3:
		case MorphType::AdditionalUV4:
			uv_offsets = std::make_unique<PmxMorphUVOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				uv_offsets[i].Read(stream, setting);
			}
			break;
		default:
			throw;
		}
	}